

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonBuilder.cpp
# Opt level: O2

bool __thiscall
helics::fileops::JsonMapBuilder::addComponent(JsonMapBuilder *this,string *info,int index)

{
  _Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
  _Var1;
  bool bVar2;
  iterator __position;
  reference pvVar3;
  initializer_list_t init;
  string_view jsonString;
  json element;
  data local_a0;
  int local_8c;
  key_type local_88 [2];
  key_type local_48;
  
  local_8c = index;
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
               ::find(&(this->missing_components)._M_t,&local_8c);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->missing_components)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            info,"#invalid");
    if (bVar2) {
      _Var1._M_head_impl =
           (this->jMap)._M_t.
           super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           .
           super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
           ._M_head_impl;
      std::__cxx11::string::string
                ((string *)&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &__position._M_node[1]._M_parent);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](_Var1._M_head_impl,&local_48);
      init._M_len = 0;
      init._M_array = (iterator)&local_a0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::object(init);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar3,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      jsonString._M_str = (char *)info->_M_string_length;
      jsonString._M_len = (size_t)&local_a0;
      loadJsonStr_abi_cxx11_(jsonString);
      _Var1._M_head_impl =
           (this->jMap)._M_t.
           super___uniq_ptr_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::default_delete<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           .
           super__Head_base<0UL,_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_false>
           ._M_head_impl;
      std::__cxx11::string::string
                ((string *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &__position._M_node[1]._M_parent);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](_Var1._M_head_impl,local_88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back(pvVar3,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&local_a0);
      std::__cxx11::string::~string((string *)local_88);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
    }
    std::
    _Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
                        *)&this->missing_components,__position);
    bVar2 = (this->missing_components)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  }
  return bVar2;
}

Assistant:

bool JsonMapBuilder::addComponent(const std::string& info, int index) noexcept
{
    auto loc = missing_components.find(index);
    if (loc != missing_components.end()) {
        if (info == "#invalid") {
            (*jMap)[loc->second.first].push_back(nlohmann::json::object());
        } else {
            try {
                auto element = loadJsonStr(info);
                (*jMap)[loc->second.first].push_back(element);
            }
            catch (const std::invalid_argument&) {
                (*jMap)[loc->second.first].push_back(nlohmann::json::object());
            }
        }

        missing_components.erase(loc);

        return missing_components.empty();
    }
    return false;
}